

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vectors.h
# Opt level: O2

Vector<Fad<double>_> * __thiscall
Vector<Fad<double>_>::operator=(Vector<Fad<double>_> *this,Vector<Fad<double>_> *a)

{
  int iVar1;
  EVP_PKEY_CTX *in_RDX;
  EVP_PKEY_CTX *extraout_RDX;
  EVP_PKEY_CTX *extraout_RDX_00;
  
  if (this != a) {
    iVar1 = this->num_elts;
    if (iVar1 == 0) {
      if (a->num_elts == 0) {
        return this;
      }
      reserve(this,a->num_elts);
      iVar1 = this->num_elts;
      in_RDX = extraout_RDX;
    }
    if (iVar1 != a->num_elts) {
      destroy(this);
      reserve(this,a->num_elts);
      in_RDX = extraout_RDX_00;
    }
    copy(this,(EVP_PKEY_CTX *)a,in_RDX);
  }
  return this;
}

Assistant:

Vector< T >& Vector< T >::operator = (const Vector< T >& a)
{
  if ( this != &a) {
    // Cas ou le pointeur est non alloue
    if ( num_elts == 0 ) {
      if ( a.num_elts == 0 ) return (*this);
      else reserve(a.num_elts);
    }
    // Cas ou le pointeur est deja alloue
    if ( num_elts != a.num_elts ) {
      //cerr << "size = " << num_elts << ", a.size = " << a.num_elts << endl;
      //cerr << "ptr_to_data = " << (void*)ptr_to_data << ", a.ptr_to_data = " << (void*)a.ptr_to_data << endl;
      //error("Vector::operator=, tailles incompatibles");
      destroy();//on desalloue
      reserve(a.num_elts);
    }
    
    copy(a);
  }

  return *this;
}